

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O3

void test_cpp_move_64(void **param_1)

{
  bool bVar1;
  long lVar2;
  const_iterator i;
  Roaring64Map roaring;
  value_type local_a8;
  Roaring64MapSetBitBiDirectionalIterator local_a0;
  Roaring64Map local_68;
  
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header;
  local_68.roarings._M_t._M_impl._0_8_ = 0;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  lVar2 = 0;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68.copyOnWrite = false;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    bVar1 = ::roaring::Roaring64Map::addChecked
                      (&local_68,*(uint64_t *)((long)&DAT_00137bb0 + lVar2));
    _assert_true((ulong)bVar1,"roaring.addChecked(values64[i])",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
                 ,0x50e);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x20);
  ::roaring::Roaring64MapSetBitBiDirectionalIterator::Roaring64MapSetBitBiDirectionalIterator
            (&local_a0,&local_68,false);
  local_a8 = 0x7b;
  ::roaring::Roaring64MapSetBitBiDirectionalIterator::move_equalorlarger(&local_a0,&local_a8);
  _assert_true((ulong)(CONCAT44(local_a0.map_iter._M_node[1]._M_color,local_a0.i.current_value) ==
                      0x7b),"*i == 123ULL",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x513);
  local_a8 = 0xafffffff8;
  ::roaring::Roaring64MapSetBitBiDirectionalIterator::move_equalorlarger(&local_a0,&local_a8);
  _assert_true((ulong)(CONCAT44(local_a0.map_iter._M_node[1]._M_color,local_a0.i.current_value) ==
                      0xfffffffff),"*i == 0xFFFFFFFFFULL",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x515);
  local_a8 = 0xffffffffff;
  bVar1 = ::roaring::Roaring64MapSetBitBiDirectionalIterator::move_equalorlarger
                    (&local_a0,&local_a8);
  _assert_true((ulong)!bVar1,"i.move_equalorlarger(0xFFFFFFFFFFULL)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x516);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&local_68);
  return;
}

Assistant:

DEFINE_TEST(test_example_true) { test_example(true); }